

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

char * __thiscall
icu_63::UnicodeKeywordEnumeration::next
          (UnicodeKeywordEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  int32_t iVar1;
  size_t sVar2;
  char *pcVar3;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (pcVar3 = (this->super_KeywordEnumeration).current, *pcVar3 != '\0')) {
    sVar2 = strlen(pcVar3);
    (this->super_KeywordEnumeration).current = pcVar3 + ((int)sVar2 + 1);
    pcVar3 = uloc_toUnicodeLocaleKey_63(pcVar3);
    if (pcVar3 != (char *)0x0) {
      if (resultLength == (int32_t *)0x0) {
        return pcVar3;
      }
      sVar2 = strlen(pcVar3);
      iVar1 = (int32_t)sVar2;
      goto LAB_0028e651;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  iVar1 = 0;
  pcVar3 = (char *)0x0;
  if (resultLength == (int32_t *)0x0) {
    return (char *)0x0;
  }
LAB_0028e651:
  *resultLength = iVar1;
  return pcVar3;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& status) {
        const char* legacy_key = KeywordEnumeration::next(nullptr, status);
        if (U_SUCCESS(status) && legacy_key != nullptr) {
            const char* key = uloc_toUnicodeLocaleKey(legacy_key);
            if (key == nullptr) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                if (resultLength != nullptr) {
                    *resultLength = static_cast<int32_t>(uprv_strlen(key));
                }
                return key;
            }
        }
        if (resultLength != nullptr) *resultLength = 0;
        return nullptr;
    }